

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffsdumper.cpp
# Opt level: O0

USTATUS __thiscall
FfsDumper::dump(FfsDumper *this,UModelIndex *root,CBString *path,DumpMode dumpMode,UINT8 sectionType
               ,CBString *guid)

{
  bool bVar1;
  char *pcVar2;
  USTATUS result;
  CBString *guid_local;
  UINT8 sectionType_local;
  DumpMode dumpMode_local;
  CBString *path_local;
  UModelIndex *root_local;
  FfsDumper *this_local;
  
  this->dumped = false;
  this->counterInfo = 0;
  this->counterRaw = 0;
  this->counterBody = 0;
  this->counterHeader = 0;
  std::set<UModelIndex,_std::less<UModelIndex>,_std::allocator<UModelIndex>_>::clear
            (&this->fileList);
  bVar1 = changeDirectory(path);
  if (bVar1) {
    pcVar2 = Bstrlib::CBString::toLocal8Bit(path);
    printf("Directory \"%s\" already exists.\n",pcVar2);
    this_local = (FfsDumper *)0x22;
  }
  else {
    Bstrlib::CBString::operator=(&this->currentPath,path);
    this_local = (FfsDumper *)recursiveDump(this,root,path,dumpMode,sectionType,guid);
    if (this_local == (FfsDumper *)0x0) {
      if ((this->dumped & 1U) == 0) {
        bVar1 = removeDirectory(path);
        if (bVar1) {
          pcVar2 = Bstrlib::CBString::toLocal8Bit(path);
          printf("Removed directory \"%s\" since nothing was dumped.\n",pcVar2);
        }
        this_local = (FfsDumper *)0x8;
      }
      else {
        this_local = (FfsDumper *)0x0;
      }
    }
    else {
      pcVar2 = Bstrlib::CBString::toLocal8Bit(path);
      printf("Error %zu returned from recursiveDump (directory \"%s\").\n",this_local,pcVar2);
    }
  }
  return (USTATUS)this_local;
}

Assistant:

USTATUS FfsDumper::dump(const UModelIndex & root, const UString & path, const DumpMode dumpMode, const UINT8 sectionType, const UString & guid)
{
    dumped = false;
    counterHeader = counterBody = counterRaw = counterInfo = 0;
    fileList.clear();

    if (changeDirectory(path)) {
        printf("Directory \"%s\" already exists.\n", (const char*)path.toLocal8Bit());
        return U_DIR_ALREADY_EXIST;
    }

    currentPath = path;

    USTATUS result = recursiveDump(root, path, dumpMode, sectionType, guid);
    if (result) {
        printf("Error %zu returned from recursiveDump (directory \"%s\").\n", result, (const char*)path.toLocal8Bit());
        return result;
    } else if (!dumped) {
        if (removeDirectory(path)) {
            printf("Removed directory \"%s\" since nothing was dumped.\n", (const char*)path.toLocal8Bit());
        }
        return U_ITEM_NOT_FOUND;
    }

    return U_SUCCESS;
}